

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O1

string * __thiscall
upb::generator::PadPrefix_abi_cxx11_(string *__return_storage_ptr__,generator *this,string_view tag)

{
  AlphaNum local_68;
  undefined8 local_38;
  char *local_30;
  
  local_68.piece_._M_str = (char *)tag._M_len;
  if (this == (generator *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"","",tag._M_str);
  }
  else {
    local_38 = 1;
    local_30 = " ";
    local_68.piece_._M_len = (size_t)this;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_38,&local_68,&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PadPrefix(absl::string_view tag) {
  return tag.empty() ? "" : absl::StrCat(" ", tag);
}